

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
PlatformIdNode::Evaluate
          (string *__return_storage_ptr__,PlatformIdNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *param_3,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmMakefile *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __type _Var1;
  string *__rhs;
  char *__s;
  allocator<char> local_41;
  string local_40;
  
  this_00 = context->LG->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SYSTEM_NAME",&local_41);
  __rhs = cmMakefile::GetSafeDefinition(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  __lhs = (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (parameters->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__rhs);
  }
  else {
    if (__rhs->_M_string_length == 0) {
      __s = "0";
      if (__lhs->_M_string_length == 0) {
        __s = "1";
      }
    }
    else {
      _Var1 = std::operator==(__lhs,__rhs);
      if (_Var1) {
        __s = "1";
      }
      else {
        __s = "0";
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* /*content*/,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::string const& platformId =
      context->LG->GetMakefile()->GetSafeDefinition("CMAKE_SYSTEM_NAME");
    if (parameters.empty()) {
      return platformId;
    }

    if (platformId.empty()) {
      return parameters.front().empty() ? "1" : "0";
    }

    if (parameters.front() == platformId) {
      return "1";
    }
    return "0";
  }